

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsPSolve(void *arkode_mem,N_Vector r,N_Vector z,realtype tol,int lr)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  void *in_RDI;
  undefined8 in_XMM0_Qa;
  int retval;
  int *jcur;
  int dgamma_fail;
  realtype gamrat;
  realtype gamma;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem *in_stack_ffffffffffffffa0;
  ARKodeMem *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  long local_40;
  ARKodeMem local_38;
  uint local_4;
  
  local_4 = arkLs_AccessLMem(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (local_4 == 0) {
    local_4 = (*local_38->step_getgammas)
                        (in_RDI,(realtype *)&stack0xffffffffffffffb8,
                         (realtype *)&stack0xffffffffffffffb0,(int **)&stack0xffffffffffffffa0,
                         (int *)&stack0xffffffffffffffac);
    if (local_4 == 0) {
      local_4 = (**(code **)(local_40 + 0xd0))
                          (*(undefined8 *)(local_40 + 0x78),in_stack_ffffffffffffffb8,in_XMM0_Qa,
                           *(undefined8 *)(local_40 + 0x60),*(undefined8 *)(local_40 + 0x68),in_RSI,
                           in_RDX,in_ECX,*(undefined8 *)(local_40 + 0xe0));
      *(long *)(local_40 + 0xa8) = *(long *)(local_40 + 0xa8) + 1;
    }
    else {
      arkProcessError(local_38,(int)(ulong)local_4,"ARKLS","arkLsPSolve",
                      "An error occurred in ark_step_getgammas");
    }
  }
  return local_4;
}

Assistant:

int arkLsPSolve(void *arkode_mem, N_Vector r, N_Vector z,
                realtype tol, int lr)
{
  ARKodeMem   ark_mem;
  ARKLsMem    arkls_mem;
  realtype    gamma, gamrat;
  booleantype dgamma_fail, *jcur;
  int         retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLsPSolve",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* get gamma values from time step module */
  retval = ark_mem->step_getgammas(arkode_mem, &gamma, &gamrat,
                                   &jcur, &dgamma_fail);
  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKLS", "arkLsPSolve",
                    "An error occurred in ark_step_getgammas");
    return(retval);
  }

  /* call the user-supplied psolve routine, and accumulate count */
  retval = arkls_mem->psolve(arkls_mem->tcur,
                             arkls_mem->ycur,
                             arkls_mem->fcur, r, z,
                             gamma, tol, lr,
                             arkls_mem->P_data);
  arkls_mem->nps++;
  return(retval);
}